

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetDelayAA(void *kinmem,long delay)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x98;
  }
  else {
    if (-1 < delay) {
      *(long *)((long)kinmem + 0x1c8) = delay;
      return 0;
    }
    msgfmt = "delay < 0 illegal";
    error_code = -2;
    line = 0xa1;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetDelayAA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int KINSetDelayAA(void* kinmem, long int delay)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  /* check for illegal input value */
  if (delay < 0)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "delay < 0 illegal");
    return (KIN_ILL_INPUT);
  }

  kin_mem->kin_delay_aa = delay;

  return (KIN_SUCCESS);
}